

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence_helpers.cpp
# Opt level: O2

SENode * __thiscall
spvtools::opt::LoopDependenceAnalysis::GetFirstTripInductionNode
          (LoopDependenceAnalysis *this,Loop *loop)

{
  bool bVar1;
  BasicBlock *condition_block;
  Instruction *induction;
  SENode *pSVar2;
  int64_t induction_initial_value;
  int64_t local_18;
  
  condition_block = Loop::FindConditionBlock(loop);
  if ((condition_block != (BasicBlock *)0x0) &&
     (induction = Loop::FindConditionVariable(loop,condition_block), induction != (Instruction *)0x0
     )) {
    local_18 = 0;
    bVar1 = Loop::GetInductionInitValue(loop,induction,&local_18);
    if (bVar1) {
      pSVar2 = ScalarEvolutionAnalysis::CreateConstant(&this->scalar_evolution_,local_18);
      pSVar2 = ScalarEvolutionAnalysis::SimplifyExpression(&this->scalar_evolution_,pSVar2);
      return pSVar2;
    }
  }
  return (SENode *)0x0;
}

Assistant:

SENode* LoopDependenceAnalysis::GetFirstTripInductionNode(const Loop* loop) {
  BasicBlock* condition_block = loop->FindConditionBlock();
  if (!condition_block) {
    return nullptr;
  }
  Instruction* induction_instr = loop->FindConditionVariable(condition_block);
  if (!induction_instr) {
    return nullptr;
  }
  int64_t induction_initial_value = 0;
  if (!loop->GetInductionInitValue(induction_instr, &induction_initial_value)) {
    return nullptr;
  }

  SENode* induction_init_SENode = scalar_evolution_.SimplifyExpression(
      scalar_evolution_.CreateConstant(induction_initial_value));
  return induction_init_SENode;
}